

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFileListGeneratorBase::Consider
          (cmFileListGeneratorBase *this,string *fullPath,cmFileList *listing)

{
  cmFileListGeneratorBase *pcVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  int iVar3;
  
  pcVar1 = (this->Next)._M_t.
           super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
           .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
  if (pcVar1 == (cmFileListGeneratorBase *)0x0) {
    std::operator+(&bStack_38,fullPath,"/");
    iVar3 = (*listing->_vptr_cmFileList[2])(listing,&bStack_38);
    uVar2 = (undefined1)iVar3;
  }
  else {
    std::operator+(&bStack_38,fullPath,"/");
    iVar3 = (*pcVar1->_vptr_cmFileListGeneratorBase[2])(pcVar1,&bStack_38,listing);
    uVar2 = (undefined1)iVar3;
  }
  std::__cxx11::string::~string((string *)&bStack_38);
  return (bool)uVar2;
}

Assistant:

bool cmFileListGeneratorBase::Consider(std::string const& fullPath,
                                       cmFileList& listing)
{
  if (this->Next) {
    return this->Next->Search(fullPath + "/", listing);
  }
  return listing.Visit(fullPath + "/");
}